

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBlendTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::BlendCase::BlendCase
          (BlendCase *this,Context *context,char *name,char *desc,
          vector<deqp::gles3::Functional::BlendParams,_std::allocator<deqp::gles3::Functional::BlendParams>_>
          *paramSets,bool useSrgbFbo)

{
  int iVar1;
  RenderTarget *pRVar2;
  int iVar3;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,desc);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BlendCase_00d2f240;
  std::
  vector<deqp::gles3::Functional::BlendParams,_std::allocator<deqp::gles3::Functional::BlendParams>_>
  ::vector(&this->m_paramSets,paramSets);
  this->m_curParamSetNdx = 0;
  this->m_useSrgbFbo = useSrgbFbo;
  this->m_colorRbo = 0;
  this->m_fbo = 0;
  this->m_renderer = (QuadRenderer *)0x0;
  this->m_referenceRenderer = (ReferenceQuadRenderer *)0x0;
  this->m_refColorBuffer = (TextureLevel *)0x0;
  *(undefined8 *)(this->m_firstQuad).posA.m_data = 0xbf800000bf800000;
  *(undefined1 **)(this->m_firstQuad).posB.m_data = &DAT_3f8000003f800000;
  memset((this->m_firstQuad).color,0,0x90);
  *(undefined8 *)(this->m_secondQuad).posA.m_data = 0xbf800000bf800000;
  *(undefined1 **)(this->m_secondQuad).posB.m_data = &DAT_3f8000003f800000;
  memset((this->m_secondQuad).color,0,0x98);
  *(undefined8 *)(this->m_firstQuadInt).posB.m_data = 0x100000001;
  memset((this->m_firstQuadInt).color,0,0x98);
  *(undefined8 *)(this->m_secondQuadInt).posB.m_data = 0x100000001;
  memset((this->m_secondQuadInt).color,0,0x90);
  iVar3 = 0x80;
  iVar1 = 0x80;
  if (!useSrgbFbo) {
    pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar1 = pRVar2->m_width;
  }
  this->m_renderWidth = iVar1;
  if (this->m_useSrgbFbo == false) {
    pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar3 = pRVar2->m_height;
  }
  this->m_renderHeight = iVar3;
  this->m_viewportWidth = 0;
  this->m_viewportHeight = 0;
  return;
}

Assistant:

BlendCase::BlendCase (Context&						context,
					  const char*					name,
					  const char*					desc,
					  const vector<BlendParams>&	paramSets,
					  bool							useSrgbFbo)
	: TestCase				(context, name, desc)
	, m_paramSets			(paramSets)
	, m_curParamSetNdx		(0)
	, m_useSrgbFbo			(useSrgbFbo)
	, m_colorRbo			(0)
	, m_fbo					(0)
	, m_renderer			(DE_NULL)
	, m_referenceRenderer	(DE_NULL)
	, m_refColorBuffer		(DE_NULL)
	, m_renderWidth			(m_useSrgbFbo ? 2*MAX_VIEWPORT_WIDTH	: m_context.getRenderTarget().getWidth())
	, m_renderHeight		(m_useSrgbFbo ? 2*MAX_VIEWPORT_HEIGHT	: m_context.getRenderTarget().getHeight())
	, m_viewportWidth		(0)
	, m_viewportHeight		(0)
{
	DE_ASSERT(!m_paramSets.empty());
}